

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void ecs_colsystem_dtor(ecs_world_t *world,ecs_entity_t component,ecs_entity_t *entities,void *ptr,
                       size_t size,int32_t count,void *ctx)

{
  ecs_entity_t system;
  _Bool _Var1;
  int32_t iVar2;
  ecs_entity_t e;
  EcsSystem *cur;
  int i;
  EcsSystem *system_data;
  int32_t count_local;
  size_t size_local;
  void *ptr_local;
  ecs_entity_t *entities_local;
  ecs_entity_t component_local;
  ecs_world_t *world_local;
  
  for (cur._4_4_ = 0; cur._4_4_ < count; cur._4_4_ = cur._4_4_ + 1) {
    system = entities[cur._4_4_];
    if (*(long *)((long)ptr + (long)cur._4_4_ * 0x50 + 0x18) != 0) {
      iVar2 = ecs_vector_count(*(ecs_vector_t **)
                                (*(long *)((long)ptr + (long)cur._4_4_ * 0x50 + 0x18) + 0x20));
      if (iVar2 != 0) {
        invoke_status_action(world,system,(EcsSystem *)ptr,EcsSystemDeactivated);
      }
    }
    _Var1 = ecs_has_entity(world,system,0x103);
    if (!_Var1) {
      _Var1 = ecs_has_entity(world,system,0x104);
      if (!_Var1) {
        invoke_status_action(world,system,(EcsSystem *)ptr,EcsSystemDisabled);
      }
    }
    (*ecs_os_api.free_)(*(void **)((long)ptr + (long)cur._4_4_ * 0x50 + 0x20));
  }
  return;
}

Assistant:

static
void ecs_colsystem_dtor(
    ecs_world_t *world,
    ecs_entity_t component,
    const ecs_entity_t *entities,
    void *ptr,
    size_t size,
    int32_t count,
    void *ctx)
{
    (void)component;
    (void)ctx;
    (void)size;

    EcsSystem *system_data = ptr;

    int i;
    for (i = 0; i < count; i ++) {
        EcsSystem *cur = &system_data[i];
        ecs_entity_t e = entities[i];

        /* Invoke Deactivated action for active systems */
        if (cur->query && ecs_vector_count(cur->query->tables)) {
            invoke_status_action(world, e, ptr, EcsSystemDeactivated);
        }

        /* Invoke Disabled action for enabled systems */
        if (!ecs_has_entity(world, e, EcsDisabled) && 
            !ecs_has_entity(world, e, EcsDisabledIntern)) 
        {
            invoke_status_action(world, e, ptr, EcsSystemDisabled);
        }           

        ecs_os_free(cur->on_demand);
    }
}